

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

SobolSampler *
pbrt::SobolSampler::Create
          (ParameterDictionary *parameters,Point2i fullResolution,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  int *piVar4;
  SobolSampler *pSVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int seed;
  string s;
  RandomizeStrategy randomizer;
  int nsamp;
  string *in_stack_fffffffffffffea8;
  ParameterDictionary *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed4;
  undefined1 in_stack_fffffffffffffed5;
  undefined1 in_stack_fffffffffffffed6;
  allocator<char> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *in_stack_fffffffffffffee8;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  string *name;
  ParameterDictionary *in_stack_ffffffffffffff08;
  string local_f0 [32];
  int local_d0;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [32];
  string local_80 [32];
  undefined4 local_60;
  undefined1 local_49 [37];
  int local_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  name = (string *)local_49;
  local_18 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
             ,in_stack_fffffffffffffee0);
  iVar3 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  local_24 = iVar3;
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(Options + 0x44));
  if (bVar1) {
    piVar4 = pstd::optional<int>::operator*((optional<int> *)0x82be9f);
    local_24 = *piVar4;
  }
  if ((*(byte *)(Options + 0x54) & 1) != 0) {
    local_24 = 1;
  }
  __s = &local_a1;
  args = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffef0),(char *)__s,(allocator<char> *)args);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffef0),(char *)__s,(allocator<char> *)args);
  ParameterDictionary::GetOneString(in_stack_ffffffffffffff08,name,in_RDI);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
  if ((bool)uVar2) {
    local_60 = 0;
  }
  else {
    in_stack_fffffffffffffed6 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    if ((bool)in_stack_fffffffffffffed6) {
      local_60 = 1;
    }
    else {
      in_stack_fffffffffffffed5 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
      if ((bool)in_stack_fffffffffffffed5) {
        local_60 = 2;
      }
      else {
        in_stack_fffffffffffffed4 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
        if (!(bool)in_stack_fffffffffffffed4) {
          ErrorExit<std::__cxx11::string&>
                    ((FileLoc *)CONCAT44(iVar3,in_stack_fffffffffffffef0),(char *)__s,args);
        }
        local_60 = 3;
      }
    }
  }
  piVar4 = (int *)&stack0xffffffffffffff0f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffef0),(char *)__s,(allocator<char> *)args);
  iVar3 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
  local_d0 = iVar3;
  pSVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SobolSampler,int&,pbrt::Point2<int>&,pbrt::RandomizeStrategy&,int&>
                     ((polymorphic_allocator<std::byte> *)
                      CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffed6,
                                              CONCAT15(in_stack_fffffffffffffed5,
                                                       CONCAT14(in_stack_fffffffffffffed4,
                                                                in_stack_fffffffffffffed0)))),piVar4
                      ,(Point2<int> *)local_18,
                      (RandomizeStrategy *)CONCAT44(iVar3,in_stack_fffffffffffffeb8),
                      (int *)in_stack_fffffffffffffeb0);
  std::__cxx11::string::~string(local_80);
  return pSVar5;
}

Assistant:

SobolSampler *SobolSampler::Create(const ParameterDictionary &parameters,
                                   Point2i fullResolution, const FileLoc *loc,
                                   Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;

    RandomizeStrategy randomizer;
    std::string s = parameters.GetOneString("randomization", "fastowen");
    if (s == "none")
        randomizer = RandomizeStrategy::None;
    else if (s == "permutedigits")
        randomizer = RandomizeStrategy::PermuteDigits;
    else if (s == "fastowen")
        randomizer = RandomizeStrategy::FastOwen;
    else if (s == "owen")
        randomizer = RandomizeStrategy::Owen;
    else
        ErrorExit(loc, "%s: unknown randomization strategy given to SobolSampler", s);

    int seed = parameters.GetOneInt("seed", Options->seed);

    return alloc.new_object<SobolSampler>(nsamp, fullResolution, randomizer, seed);
}